

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32VecHelper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  bool bVar1;
  uint32_t uVar2;
  spv_result_t sVar3;
  ostream *poVar4;
  uint32_t uVar5;
  undefined4 in_register_0000000c;
  ostringstream ss;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  uVar5 = num_components;
  bVar1 = ValidationState_t::IsFloatVectorType(this->_,underlying_type);
  if (bVar1) {
    ValidationState_t::GetDimension(this->_,underlying_type);
    uVar2 = ValidationState_t::GetDimension(this->_,underlying_type);
    if (uVar2 == num_components) {
      uVar2 = ValidationState_t::GetBitWidth(this->_,underlying_type);
      if (uVar2 == 0x20) {
        return SPV_SUCCESS;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1c8,decoration,(Decoration *)inst,
                 (Instruction *)CONCAT44(in_register_0000000c,uVar5));
      poVar4 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      poVar4 = std::operator<<(poVar4," has components with bit width ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,".");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::stringbuf::str();
      sVar3 = std::
              function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(diag,&local_1c8);
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1c8,decoration,(Decoration *)inst,
                 (Instruction *)CONCAT44(in_register_0000000c,uVar5));
      poVar4 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      poVar4 = std::operator<<(poVar4," has ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," components.");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::stringbuf::str();
      sVar3 = std::
              function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(diag,&local_1c8);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1c8,decoration,(Decoration *)inst,
               (Instruction *)CONCAT44(in_register_0000000c,uVar5));
    std::operator+(local_1a8,&local_1c8," is not a float vector.");
    sVar3 = std::
            function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(diag,local_1a8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return sVar3;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32VecHelper(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  if (!_.IsFloatVectorType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " is not a float vector.");
  }

  const uint32_t actual_num_components = _.GetDimension(underlying_type);
  if (_.GetDimension(underlying_type) != num_components) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has "
       << actual_num_components << " components.";
    return diag(ss.str());
  }

  const uint32_t bit_width = _.GetBitWidth(underlying_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}